

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_h_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar11 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 uVar5;
  
  uVar1 = *(ulong *)left;
  uVar5 = (undefined1)(uVar1 >> 0x38);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = uVar5;
  auVar4[0xf] = uVar5;
  uVar5 = (undefined1)(uVar1 >> 0x30);
  auVar11._14_2_ = auVar4._14_2_;
  auVar11._8_5_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xd] = uVar5;
  auVar9._13_3_ = auVar11._13_3_;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = uVar5;
  uVar5 = (undefined1)(uVar1 >> 0x28);
  auVar10._12_4_ = auVar9._12_4_;
  auVar10._8_3_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xb] = uVar5;
  auVar8._11_5_ = auVar10._11_5_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[10] = uVar5;
  uVar5 = (undefined1)(uVar1 >> 0x20);
  auVar6._10_6_ = auVar8._10_6_;
  auVar6[8] = 0;
  auVar6._0_8_ = uVar1;
  auVar6[9] = uVar5;
  auVar3._9_7_ = auVar6._9_7_;
  auVar3[8] = uVar5;
  auVar3._0_8_ = uVar1;
  uVar5 = (undefined1)(uVar1 >> 0x18);
  auVar2._8_8_ = auVar3._8_8_;
  auVar2[7] = uVar5;
  auVar2[6] = uVar5;
  uVar5 = (undefined1)(uVar1 >> 0x10);
  auVar2[5] = uVar5;
  auVar2[4] = uVar5;
  uVar5 = (undefined1)(uVar1 >> 8);
  auVar2[3] = uVar5;
  auVar2[2] = uVar5;
  auVar2[0] = (undefined1)uVar1;
  auVar2[1] = auVar2[0];
  auVar6 = pshuflw(in_XMM1,auVar2,0);
  auVar8 = pshuflw(in_XMM2,auVar2,0x55);
  auVar9 = pshuflw(in_XMM3,auVar2,0xaa);
  auVar11 = pshuflw(in_XMM4,auVar2,0xff);
  *(int *)dst = auVar6._0_4_;
  *(int *)(dst + stride) = auVar8._0_4_;
  *(int *)(dst + stride * 2) = auVar9._0_4_;
  *(int *)(dst + stride * 3) = auVar11._0_4_;
  auVar7._8_4_ = auVar3._8_4_;
  auVar7._0_8_ = auVar2._8_8_;
  auVar7._12_4_ = auVar10._12_4_;
  auVar8 = pshuflw(auVar8,auVar7,0x55);
  auVar10 = pshuflw(auVar9,auVar7,0xaa);
  auVar6 = pshuflw(auVar7,auVar7,0xff);
  *(uint *)(dst + stride * 4) = CONCAT22(auVar3._8_2_,auVar3._8_2_);
  *(int *)(dst + stride * 5) = auVar8._0_4_;
  *(int *)(dst + stride * 6) = auVar10._0_4_;
  *(int *)(dst + stride * 7) = auVar6._0_4_;
  return;
}

Assistant:

void aom_h_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i left_col = _mm_loadl_epi64((__m128i const *)left);
  left_col = _mm_unpacklo_epi8(left_col, left_col);
  __m128i row0 = _mm_shufflelo_epi16(left_col, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;
  left_col = _mm_unpackhi_epi64(left_col, left_col);
  row0 = _mm_shufflelo_epi16(left_col, 0);
  row1 = _mm_shufflelo_epi16(left_col, 0x55);
  row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
}